

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

bool SingleTreeSearchHelperBool
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBool *a_result)

{
  int iVar1;
  bool bVar2;
  ON__INT_PTR *pOVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  
  iVar1 = a_nodeB->m_count;
  if (a_nodeB->m_level < 1) {
    if (0 < iVar1) {
      paVar4 = &a_nodeB->m_branch[0].field_1;
      do {
        if (((a_branchA < (ON_RTreeBranch *)(paVar4 + -6)) &&
            (bVar2 = PairSearchOverlapHelper
                               (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar4 + -6),
                                a_result->m_tolerance), bVar2)) &&
           (bVar2 = (*a_result->m_resultCallbackBool)
                              (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                               (ON__INT_PTR)paVar4->m_child), !bVar2)) {
          return false;
        }
        pOVar3 = (ON__INT_PTR *)(paVar4 + 1);
        paVar4 = paVar4 + 7;
      } while (pOVar3 < a_nodeB->m_branch + iVar1);
    }
  }
  else if (a_nodeB < &a_nodeB->m_branch[(long)iVar1 + -1].field_1) {
    paVar4 = &a_nodeB->m_branch[0].field_1;
    do {
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,(ON_RTreeBBox *)(paVar4 + -6),a_result->m_tolerance);
      if ((bVar2) &&
         (bVar2 = SingleTreeSearchHelperBool(a_branchA,paVar4->m_child,a_result), !bVar2)) {
        return false;
      }
      pOVar3 = (ON__INT_PTR *)(paVar4 + 1);
      paVar4 = paVar4 + 7;
    } while (pOVar3 < a_nodeB->m_branch + iVar1);
  }
  return true;
}

Assistant:

static bool SingleTreeSearchHelperBool(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBool* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        if (!SingleTreeSearchHelperBool(a_branchA, branchB->m_child, a_result))
          return false;
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are all leaves
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          if (!a_result->m_resultCallbackBool(a_result->m_context, a_branchA->m_id, branchB->m_id))
            return false;
        }
      }
      branchB++;
    }
  }

  return true;
}